

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExFreakOperator.cpp
# Opt level: O1

void __thiscall lts2::ExFreakOperator::initWithPatchSize(ExFreakOperator *this,Size *patchSize)

{
  uint uVar1;
  ostream *poVar2;
  IntegratingCell *pIVar3;
  BasisFunction *pBVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint *puVar9;
  uint ring;
  int i;
  long lVar10;
  float fVar11;
  double dVar12;
  float filterSigma [8];
  float ringRadius [8];
  float local_78 [8];
  float local_58 [8];
  Size local_38;
  
  local_38.width = patchSize->width;
  local_38.height = patchSize->height;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_38);
  iVar7 = (this->super_LBDOperator)._patchSize.width;
  iVar5 = (this->super_LBDOperator)._patchSize.height;
  if (iVar7 < iVar5) {
    iVar5 = iVar7;
  }
  local_58[0] = (float)(iVar5 / 0x19);
  fVar11 = ((float)iVar5 * 22.0) / 1575.0;
  local_58[1] = fVar11 + local_58[0];
  local_58[2] = fVar11 * 3.0 + local_58[0];
  local_58[3] = fVar11 * 6.0 + local_58[0];
  local_58[4] = fVar11 * 10.0 + local_58[0];
  local_58[5] = fVar11 * 15.0 + local_58[0];
  local_58[6] = fVar11 * 21.0 + local_58[0];
  local_58[7] = 0.0;
  local_78[0] = local_58[0] * 0.5;
  local_78[1] = local_58[1] * 0.5;
  local_78[2] = local_58[2] * 0.5;
  local_78[3] = local_58[3] * 0.5;
  local_78[4] = local_58[4] * 0.5;
  local_78[5] = local_58[5] * 0.5;
  local_78[6] = local_58[6] * 0.5;
  local_78[7] = local_58[0] / 3.0;
  lVar10 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ring[",5);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
    poVar2 = std::ostream::_M_insert<double>((double)local_58[lVar10]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)local_78[lVar10]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  (this->super_LBDOperator)._patternPoints = 0x2b;
  pIVar3 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar3 != (IntegratingCell *)0x0) {
    operator_delete__(pIVar3);
  }
  pIVar3 = (IntegratingCell *)operator_new__((ulong)(this->super_LBDOperator)._patternPoints * 0x18)
  ;
  (this->super_LBDOperator)._sensitiveCells = pIVar3;
  puVar9 = FREAKS_CELLS_PER_RING;
  lVar10 = 0;
  do {
    uVar1 = *puVar9;
    dVar12 = (double)uVar1;
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,pIVar3,uVar1,local_78[lVar10],local_58[lVar10],
               (float)(6.283185307179586 / dVar12),
               (float)((double)(int)lVar10 * (3.141592653589793 / dVar12)));
    pIVar3 = pIVar3 + uVar1;
    lVar10 = lVar10 + 1;
    puVar9 = puVar9 + 1;
  } while (lVar10 != 8);
  uVar1 = (this->super_LBDOperator)._patternPoints;
  *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc = (uVar1 - 1) * uVar1 >> 1;
  pBVar4 = (this->super_LBDOperator)._basisFunctions;
  if (pBVar4 != (BasisFunction *)0x0) {
    operator_delete__(pBVar4);
  }
  pBVar4 = (BasisFunction *)
           operator_new__((ulong)*(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc
                          << 3);
  (this->super_LBDOperator)._basisFunctions = pBVar4;
  uVar1 = (this->super_LBDOperator)._patternPoints;
  if (1 < uVar1) {
    uVar6 = 1;
    iVar7 = 0;
    do {
      uVar8 = 0;
      do {
        pBVar4[iVar7 + uVar8].pos_cell = uVar8;
        pBVar4[iVar7 + uVar8].neg_cell = uVar6;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + uVar8;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

void lts2::ExFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point

#ifdef DEBUG
    for (int i = 0; i < 8; ++i)
        std::cerr << "ring[" << i << "] = " << ringRadius[i] << " (" << filterSigma[i] << ")" << std::endl;
#endif

    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create all the possible pairs
    _pairsInUse = _patternPoints*(_patternPoints-1)/2;

    /// TODO : fix this ugly hack by a proper init of _basisFunctions in the superclass
    if (_basisFunctions) 
      delete[] _basisFunctions; 

    _basisFunctions = new lbd::BasisFunction[_pairsInUse];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            _basisFunctions[k].pos_cell = i;
            _basisFunctions[k].neg_cell = j;
        }
}